

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

uint32_t aec_get_lsb_16(aec_stream *strm)

{
  uchar uVar1;
  uchar uVar2;
  uint32_t data;
  aec_stream *strm_local;
  
  uVar1 = strm->next_in[1];
  uVar2 = *strm->next_in;
  strm->next_in = strm->next_in + 2;
  strm->avail_in = strm->avail_in - 2;
  return (uint)CONCAT11(uVar1,uVar2);
}

Assistant:

uint32_t aec_get_lsb_16(struct aec_stream *strm)
{
    uint32_t data = ((uint32_t)strm->next_in[1] << 8)
        | (uint32_t)strm->next_in[0];

    strm->next_in += 2;
    strm->avail_in -= 2;
    return data;
}